

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WriteNinjaWorkDir(cmLocalNinjaGenerator *this,ostream *os)

{
  cmGlobalNinjaGenerator *this_00;
  string *psVar1;
  ostream *poVar2;
  string ninja_workdir;
  string sStack_58;
  string local_38;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_58,"Logical path to working directory; prefix for absolute paths.",
             (allocator<char> *)&local_38);
  cmGlobalNinjaGenerator::WriteComment(os,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  this_00 = (cmGlobalNinjaGenerator *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&sStack_58,(string *)psVar1);
  cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix(this_00,&sStack_58);
  poVar2 = std::operator<<(os,"cmake_ninja_workdir = ");
  cmGlobalNinjaGenerator::EncodePath(&local_38,this_00,&sStack_58);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaWorkDir(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  cmGlobalNinjaGenerator::WriteComment(
    os, "Logical path to working directory; prefix for absolute paths.");
  cmGlobalNinjaGenerator* ng = this->GetGlobalNinjaGenerator();
  std::string ninja_workdir = this->GetBinaryDirectory();
  ng->StripNinjaOutputPathPrefixAsSuffix(ninja_workdir); // Also appends '/'.
  os << "cmake_ninja_workdir = " << ng->EncodePath(ninja_workdir) << "\n";
}